

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSTSHarness.cpp
# Opt level: O3

void __thiscall BaseHarnessHandlers::error(BaseHarnessHandlers *this,SAXParseException *e)

{
  wchar16 *pwVar1;
  char *pcVar2;
  size_t sVar3;
  ostream *poVar4;
  StrX local_30;
  StrX local_28;
  
  this->fSawErrors = true;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nError at file ",0xf);
  pwVar1 = (wchar16 *)xercesc_4_0::SAXParseException::getSystemId();
  pcVar2 = (char *)xercesc_4_0::XMLString::transcode
                             (pwVar1,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_28.fLocalForm = pcVar2;
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1120e8);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", line ",7);
  xercesc_4_0::SAXParseException::getLineNumber();
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", char ",7);
  xercesc_4_0::SAXParseException::getColumnNumber();
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n  Message: ",0xc);
  pwVar1 = (wchar16 *)(**(code **)(*(long *)e + 0x10))(e);
  pcVar2 = (char *)xercesc_4_0::XMLString::transcode
                             (pwVar1,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_30.fLocalForm = pcVar2;
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar2,sVar3);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  StrX::~StrX(&local_30);
  StrX::~StrX(&local_28);
  return;
}

Assistant:

void BaseHarnessHandlers::error(const SAXParseException& e)
{
    fSawErrors = true;
    std::cout << "\nError at file " << StrX(e.getSystemId())
		 << ", line " << e.getLineNumber()
		 << ", char " << e.getColumnNumber()
         << "\n  Message: " << StrX(e.getMessage()) << std::endl;
}